

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# robin_hood.h
# Opt level: O1

void __thiscall
robin_hood::detail::
Table<true,_80UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::DataViewInstancer_*,_robin_hood::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
::
Destroyer<robin_hood::detail::Table<true,_80UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::DataViewInstancer_*,_robin_hood::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_false>
::nodesDoNotDeallocate
          (Destroyer<robin_hood::detail::Table<true,_80UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::DataViewInstancer_*,_robin_hood::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_false>
           *this,Table<true,_80UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::DataViewInstancer_*,_robin_hood::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *m)

{
  long *plVar1;
  undefined1 auVar2 [16];
  long *plVar3;
  ulong uVar4;
  ulong uVar5;
  long lVar6;
  ulong uVar7;
  long lVar8;
  
  m->mNumElements = 0;
  uVar4 = m->mMask + 1;
  if (uVar4 < 0x28f5c28f5c28f5d) {
    uVar5 = (uVar4 * 0x50) / 100;
  }
  else {
    auVar2._8_8_ = 0;
    auVar2._0_8_ = uVar4 >> 2;
    uVar5 = (SUB168(auVar2 * ZEXT816(0x28f5c28f5c28f5c3),8) & 0x3ffffffffffffffc) * 0x14;
  }
  uVar7 = 0xff;
  if (uVar5 < 0xff) {
    uVar7 = uVar5;
  }
  if (uVar7 + uVar4 != 0) {
    lVar8 = 0x10;
    lVar6 = 0;
    do {
      if (m->mInfo[lVar6] != '\0') {
        plVar1 = *(long **)((long)m->mKeyVals + lVar8 + -0x10);
        plVar3 = (long *)((long)&(m->mKeyVals->mData).first._M_dataplus._M_p + lVar8);
        if (plVar3 != plVar1) {
          operator_delete(plVar1,*plVar3 + 1);
        }
      }
      lVar6 = lVar6 + 1;
      lVar8 = lVar8 + 0x28;
    } while (uVar7 + uVar4 != lVar6);
  }
  return;
}

Assistant:

void nodesDoNotDeallocate(M& m) const noexcept {
            m.mNumElements = 0;
            // clear also resets mInfo to 0, that's sometimes not necessary.
            auto const numElementsWithBuffer = m.calcNumElementsWithBuffer(m.mMask + 1);
            for (size_t idx = 0; idx < numElementsWithBuffer; ++idx) {
                if (0 != m.mInfo[idx]) {
                    Node& n = m.mKeyVals[idx];
                    n.destroyDoNotDeallocate();
                    n.~Node();
                }
            }
        }